

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestCaseGroup *
vkt::api::anon_unknown_1::createGroup
          (TestContext *testCtx,char *name,char *desc,CaseDescriptions *cases)

{
  deUint32 dVar1;
  TestContext *pTVar2;
  TestContext *pTVar3;
  pointer pcVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  pointer pBVar12;
  VkDescriptorType VVar13;
  undefined3 uVar14;
  VkShaderStageFlags VVar15;
  undefined1 auVar16 [8];
  _Alloc_hider _Var17;
  TestNode *this;
  TestNode *pTVar18;
  pointer pBVar19;
  pointer pBVar20;
  long lVar21;
  ulong uVar22;
  pointer pBVar23;
  NamedParameters<vkt::api::(anonymous_namespace)::ShaderModule> *pNVar24;
  Parameters *pPVar25;
  _Alloc_hider *p_Var26;
  Parameters *pPVar27;
  string *psVar28;
  CaseDescriptions *pCVar29;
  NamedParameters<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *pNVar30;
  NamedParameters<vkt::api::(anonymous_namespace)::Instance> *pNVar31;
  NamedParameters<vkt::api::(anonymous_namespace)::DeviceMemory> *pNVar32;
  NamedParameters<vkt::api::(anonymous_namespace)::Buffer> *pNVar33;
  NamedParameters<vkt::api::(anonymous_namespace)::BufferView> *pNVar34;
  NamedParameters<vkt::api::(anonymous_namespace)::Image> *pNVar35;
  NamedParameters<vkt::api::(anonymous_namespace)::QueryPool> *pNVar36;
  NamedParameters<vkt::api::(anonymous_namespace)::Sampler> *pNVar37;
  NamedParameters<vkt::api::(anonymous_namespace)::PipelineCache> *pNVar38;
  NamedParameters<vkt::api::(anonymous_namespace)::RenderPass> *pNVar39;
  NamedParameters<vkt::api::(anonymous_namespace)::GraphicsPipeline> *pNVar40;
  NamedParameters<vkt::api::(anonymous_namespace)::ComputePipeline> *pNVar41;
  NamedParameters<vkt::api::(anonymous_namespace)::Framebuffer> *pNVar42;
  NamedParameters<vkt::api::(anonymous_namespace)::ImageView> *pNVar43;
  NamedParameters<vkt::api::(anonymous_namespace)::PipelineLayout> *pNVar44;
  pointer pBVar45;
  ulong uVar46;
  NamedParameters<vkt::api::(anonymous_namespace)::DescriptorPool> *pNVar47;
  byte bVar48;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [9];
  undefined7 uStack_19f;
  VkDescriptorPoolSize local_198 [2];
  pointer local_188;
  CaseDescriptions *local_180;
  pointer local_178;
  allocator<char> local_169;
  _Alloc_hider local_168;
  undefined1 auStack_160 [8];
  undefined1 local_158 [24];
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  undefined1 local_100 [8];
  undefined1 local_f8 [9];
  undefined7 uStack_ef;
  VkDescriptorPoolSize local_e8 [2];
  pointer local_d8;
  TestContext *local_d0;
  pointer local_c8;
  pointer local_c0;
  undefined1 local_b8 [9];
  undefined7 uStack_af;
  pointer local_a8;
  char *local_a0;
  undefined8 local_98;
  char local_90;
  undefined7 uStack_8f;
  undefined1 local_80 [8];
  pointer local_78;
  pointer local_70;
  pointer local_68 [2];
  pointer local_58;
  ulong local_50;
  TestNode *local_48;
  NamedParameters<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *local_40;
  TestContext *local_38;
  
  bVar48 = 0;
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,testCtx,name,desc);
  pNVar31 = (cases->instance).paramsBegin;
  local_180 = cases;
  if (pNVar31 != (cases->instance).paramsEnd) {
    pBVar23 = (pointer)(local_1a8 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,pNVar31->name,(allocator<char> *)local_100);
      _Var17._M_p = local_168._M_p;
      local_1a8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_1a8[8] = 0;
      pTVar2 = (TestContext *)(cases->instance).function;
      pTVar3 = this->m_testCtx;
      local_1b0 = (undefined1  [8])pBVar23;
      pTVar18 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,_Var17._M_p,(char *)pBVar23);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d229b8;
      pTVar18[1].m_testCtx = pTVar2;
      tcu::TestNode::addChild(this,pTVar18);
      if (local_1b0 != (undefined1  [8])pBVar23) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      cases = local_180;
      if ((TestContext *)local_168._M_p != (TestContext *)local_158) {
        operator_delete(local_168._M_p,(ulong)((long)(deUint32 *)local_158._0_8_ + 1));
      }
      pNVar31 = pNVar31 + 1;
    } while (pNVar31 != (cases->instance).paramsEnd);
  }
  pBVar23 = (pointer)(cases->device).paramsBegin;
  if (pBVar23 != (pointer)(cases->device).paramsEnd) {
    pBVar45 = (pointer)(local_1a8 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,*(char **)pBVar23,(allocator<char> *)local_100);
      _Var17._M_p = local_168._M_p;
      local_1a8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_1a8[8] = 0;
      pTVar2 = (TestContext *)(cases->device).function;
      pcVar4 = *(pointer *)&pBVar23->descriptorCount;
      pTVar3 = this->m_testCtx;
      local_1b0 = (undefined1  [8])pBVar45;
      local_178 = pBVar23;
      pTVar18 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,_Var17._M_p,(char *)pBVar45);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d22a58;
      pTVar18[1].m_testCtx = pTVar2;
      pTVar18[1].m_name._M_dataplus._M_p = pcVar4;
      tcu::TestNode::addChild(this,pTVar18);
      if (local_1b0 != (undefined1  [8])pBVar45) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      pBVar23 = local_178;
      cases = local_180;
      if ((TestContext *)local_168._M_p != (TestContext *)local_158) {
        operator_delete(local_168._M_p,(ulong)((long)(deUint32 *)local_158._0_8_ + 1));
      }
      pBVar23 = (pointer)&pBVar23->useImmutableSampler;
    } while (pBVar23 != (pointer)(cases->device).paramsEnd);
  }
  pNVar32 = (cases->deviceMemory).paramsBegin;
  if (pNVar32 != (cases->deviceMemory).paramsEnd) {
    pBVar23 = (pointer)(local_1a8 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,pNVar32->name,(allocator<char> *)local_100);
      _Var17._M_p = local_168._M_p;
      local_1a8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_1a8[8] = 0;
      pTVar2 = (TestContext *)(cases->deviceMemory).function;
      local_178 = (pointer)(pNVar32->parameters).size;
      local_d0 = (TestContext *)CONCAT44(local_d0._4_4_,(pNVar32->parameters).memoryTypeIndex);
      pTVar3 = this->m_testCtx;
      local_1b0 = (undefined1  [8])pBVar23;
      pTVar18 = (TestNode *)operator_new(0x90);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,_Var17._M_p,(char *)pBVar23);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d22af8;
      pTVar18[1].m_testCtx = pTVar2;
      pTVar18[1].m_name._M_dataplus._M_p = (pointer)local_178;
      *(undefined4 *)&pTVar18[1].m_name._M_string_length = local_d0._0_4_;
      tcu::TestNode::addChild(this,pTVar18);
      if (local_1b0 != (undefined1  [8])pBVar23) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      cases = local_180;
      if ((TestContext *)local_168._M_p != (TestContext *)local_158) {
        operator_delete(local_168._M_p,(ulong)((long)(deUint32 *)local_158._0_8_ + 1));
      }
      pNVar32 = pNVar32 + 1;
    } while (pNVar32 != (cases->deviceMemory).paramsEnd);
  }
  pNVar33 = (cases->buffer).paramsBegin;
  if (pNVar33 != (cases->buffer).paramsEnd) {
    pBVar23 = (pointer)(local_1a8 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,pNVar33->name,(allocator<char> *)local_100);
      _Var17._M_p = local_168._M_p;
      local_1a8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_1a8[8] = 0;
      pTVar2 = (TestContext *)(cases->buffer).function;
      local_178 = (pointer)(pNVar33->parameters).size;
      local_d0 = (TestContext *)CONCAT44(local_d0._4_4_,(pNVar33->parameters).usage);
      pTVar3 = this->m_testCtx;
      local_1b0 = (undefined1  [8])pBVar23;
      pTVar18 = (TestNode *)operator_new(0x90);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,_Var17._M_p,(char *)pBVar23);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d22b98;
      pTVar18[1].m_testCtx = pTVar2;
      pTVar18[1].m_name._M_dataplus._M_p = (pointer)local_178;
      *(undefined4 *)&pTVar18[1].m_name._M_string_length = local_d0._0_4_;
      tcu::TestNode::addChild(this,pTVar18);
      if (local_1b0 != (undefined1  [8])pBVar23) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      cases = local_180;
      if ((TestContext *)local_168._M_p != (TestContext *)local_158) {
        operator_delete(local_168._M_p,(ulong)((long)(deUint32 *)local_158._0_8_ + 1));
      }
      pNVar33 = pNVar33 + 1;
    } while (pNVar33 != (cases->buffer).paramsEnd);
  }
  pNVar34 = (cases->bufferView).paramsBegin;
  if (pNVar34 != (cases->bufferView).paramsEnd) {
    pBVar23 = (pointer)(local_f8 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,pNVar34->name,(allocator<char> *)local_80);
      auVar16 = local_1b0;
      local_f8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_f8[8] = 0;
      pTVar2 = (TestContext *)(cases->bufferView).function;
      local_158._16_8_ = (pNVar34->parameters).range;
      local_168._M_p = (pointer)(pNVar34->parameters).buffer.size;
      auStack_160 = *(undefined1 (*) [8])&(pNVar34->parameters).buffer.usage;
      local_158._0_8_ = *(undefined8 *)&(pNVar34->parameters).format;
      local_158._8_8_ = (pNVar34->parameters).offset;
      pTVar3 = this->m_testCtx;
      local_100 = (undefined1  [8])pBVar23;
      pTVar18 = (TestNode *)operator_new(0xa8);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,(char *)auVar16,(char *)pBVar23);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d22c38;
      pTVar18[1].m_testCtx = pTVar2;
      pTVar18[1].m_name._M_dataplus._M_p = local_168._M_p;
      pTVar18[1].m_name._M_string_length = (size_type)auStack_160;
      pTVar18[1].m_name.field_2._M_allocated_capacity = local_158._0_8_;
      *(undefined8 *)((long)&pTVar18[1].m_name.field_2 + 8) = local_158._8_8_;
      pTVar18[1].m_description._M_dataplus._M_p = (pointer)local_158._16_8_;
      tcu::TestNode::addChild(this,pTVar18);
      if (local_100 != (undefined1  [8])pBVar23) {
        operator_delete((void *)local_100,CONCAT71(uStack_ef,local_f8[8]) + 1);
      }
      cases = local_180;
      if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      pNVar34 = pNVar34 + 1;
    } while (pNVar34 != (cases->bufferView).paramsEnd);
  }
  pNVar35 = (cases->image).paramsBegin;
  if (pNVar35 != (cases->image).paramsEnd) {
    pBVar23 = (pointer)(local_f8 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,pNVar35->name,(allocator<char> *)local_80);
      auVar16 = local_1b0;
      local_f8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_f8[8] = 0;
      pTVar2 = (TestContext *)(cases->image).function;
      local_168._M_p = *(pointer *)&pNVar35->parameters;
      auStack_160 = *(undefined1 (*) [8])&(pNVar35->parameters).format;
      local_158._0_8_ = *(undefined8 *)&(pNVar35->parameters).extent.height;
      local_158._8_8_ = *(undefined8 *)&(pNVar35->parameters).mipLevels;
      local_158._16_8_ = *(undefined8 *)&(pNVar35->parameters).samples;
      uVar5 = (pNVar35->parameters).usage;
      uVar6 = (pNVar35->parameters).initialLayout;
      pTVar3 = this->m_testCtx;
      uStack_140 = uVar5;
      uStack_13c = uVar6;
      local_100 = (undefined1  [8])pBVar23;
      pTVar18 = (TestNode *)operator_new(0xb0);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,(char *)auVar16,(char *)pBVar23);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d22cd8;
      pTVar18[1].m_testCtx = pTVar2;
      pTVar18[1].m_name._M_dataplus._M_p = local_168._M_p;
      pTVar18[1].m_name._M_string_length = (size_type)auStack_160;
      pTVar18[1].m_name.field_2._M_allocated_capacity = local_158._0_8_;
      *(undefined8 *)((long)&pTVar18[1].m_name.field_2 + 8) = local_158._8_8_;
      pTVar18[1].m_description._M_dataplus._M_p = (pointer)local_158._16_8_;
      pTVar18[1].m_description._M_string_length = CONCAT44(uStack_13c,uStack_140);
      tcu::TestNode::addChild(this,pTVar18);
      if (local_100 != (undefined1  [8])pBVar23) {
        operator_delete((void *)local_100,CONCAT71(uStack_ef,local_f8[8]) + 1);
      }
      cases = local_180;
      if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      pNVar35 = pNVar35 + 1;
    } while (pNVar35 != (cases->image).paramsEnd);
  }
  pNVar43 = (cases->imageView).paramsBegin;
  if (pNVar43 != (cases->imageView).paramsEnd) {
    pBVar23 = (pointer)(local_f8 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,pNVar43->name,(allocator<char> *)local_80);
      auVar16 = local_1b0;
      local_f8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_f8[8] = 0;
      pTVar2 = (TestContext *)(cases->imageView).function;
      pPVar25 = &pNVar43->parameters;
      p_Var26 = &local_168;
      local_100 = (undefined1  [8])pBVar23;
      for (lVar21 = 0xb; lVar21 != 0; lVar21 = lVar21 + -1) {
        p_Var26->_M_p = *(pointer *)&pPVar25->image;
        pPVar25 = (Parameters *)((long)pPVar25 + (ulong)bVar48 * -0x10 + 8);
        p_Var26 = p_Var26 + (ulong)bVar48 * -2 + 1;
      }
      local_110._M_allocated_capacity._0_4_ = (pNVar43->parameters).subresourceRange.layerCount;
      pTVar3 = this->m_testCtx;
      pTVar18 = (TestNode *)operator_new(0xe0);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,(char *)auVar16,(char *)pBVar23);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d22d78;
      pTVar18[1].m_testCtx = pTVar2;
      p_Var26 = &local_168;
      psVar28 = &pTVar18[1].m_name;
      for (lVar21 = 0xb; lVar21 != 0; lVar21 = lVar21 + -1) {
        (psVar28->_M_dataplus)._M_p = p_Var26->_M_p;
        p_Var26 = p_Var26 + (ulong)bVar48 * -2 + 1;
        psVar28 = (string *)((long)psVar28 + (ulong)bVar48 * -0x10 + 8);
      }
      *(undefined4 *)
       &pTVar18[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = local_110._M_allocated_capacity._0_4_;
      tcu::TestNode::addChild(this,pTVar18);
      if (local_100 != (undefined1  [8])pBVar23) {
        operator_delete((void *)local_100,CONCAT71(uStack_ef,local_f8[8]) + 1);
      }
      cases = local_180;
      if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      pNVar43 = pNVar43 + 1;
    } while (pNVar43 != (cases->imageView).paramsEnd);
  }
  pBVar23 = (pointer)(cases->semaphore).paramsBegin;
  if (pBVar23 != (pointer)(cases->semaphore).paramsEnd) {
    pBVar45 = (pointer)(local_1a8 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,*(char **)pBVar23,(allocator<char> *)local_100);
      _Var17._M_p = local_168._M_p;
      local_1a8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_1a8[8] = 0;
      pTVar2 = (TestContext *)(cases->semaphore).function;
      dVar1 = pBVar23->descriptorCount;
      pTVar3 = this->m_testCtx;
      local_1b0 = (undefined1  [8])pBVar45;
      local_178 = pBVar23;
      pTVar18 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,_Var17._M_p,(char *)pBVar45);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d22e18;
      pTVar18[1].m_testCtx = pTVar2;
      *(deUint32 *)&pTVar18[1].m_name._M_dataplus._M_p = dVar1;
      tcu::TestNode::addChild(this,pTVar18);
      if (local_1b0 != (undefined1  [8])pBVar45) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      pBVar23 = local_178;
      cases = local_180;
      if ((TestContext *)local_168._M_p != (TestContext *)local_158) {
        operator_delete(local_168._M_p,(ulong)((long)(deUint32 *)local_158._0_8_ + 1));
      }
      pBVar23 = (pointer)&pBVar23->useImmutableSampler;
    } while (pBVar23 != (pointer)(cases->semaphore).paramsEnd);
  }
  pBVar23 = (pointer)(cases->event).paramsBegin;
  if (pBVar23 != (pointer)(cases->event).paramsEnd) {
    pBVar45 = (pointer)(local_1a8 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,*(char **)pBVar23,(allocator<char> *)local_100);
      _Var17._M_p = local_168._M_p;
      local_1a8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_1a8[8] = 0;
      pTVar2 = (TestContext *)(cases->event).function;
      dVar1 = pBVar23->descriptorCount;
      pTVar3 = this->m_testCtx;
      local_1b0 = (undefined1  [8])pBVar45;
      local_178 = pBVar23;
      pTVar18 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,_Var17._M_p,(char *)pBVar45);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d22eb8;
      pTVar18[1].m_testCtx = pTVar2;
      *(deUint32 *)&pTVar18[1].m_name._M_dataplus._M_p = dVar1;
      tcu::TestNode::addChild(this,pTVar18);
      if (local_1b0 != (undefined1  [8])pBVar45) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      pBVar23 = local_178;
      cases = local_180;
      if ((TestContext *)local_168._M_p != (TestContext *)local_158) {
        operator_delete(local_168._M_p,(ulong)((long)(deUint32 *)local_158._0_8_ + 1));
      }
      pBVar23 = (pointer)&pBVar23->useImmutableSampler;
    } while (pBVar23 != (pointer)(cases->event).paramsEnd);
  }
  pBVar23 = (pointer)(cases->fence).paramsBegin;
  if (pBVar23 != (pointer)(cases->fence).paramsEnd) {
    pBVar45 = (pointer)(local_1a8 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,*(char **)pBVar23,(allocator<char> *)local_100);
      _Var17._M_p = local_168._M_p;
      local_1a8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_1a8[8] = 0;
      pTVar2 = (TestContext *)(cases->fence).function;
      dVar1 = pBVar23->descriptorCount;
      pTVar3 = this->m_testCtx;
      local_1b0 = (undefined1  [8])pBVar45;
      local_178 = pBVar23;
      pTVar18 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,_Var17._M_p,(char *)pBVar45);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d22f58;
      pTVar18[1].m_testCtx = pTVar2;
      *(deUint32 *)&pTVar18[1].m_name._M_dataplus._M_p = dVar1;
      tcu::TestNode::addChild(this,pTVar18);
      if (local_1b0 != (undefined1  [8])pBVar45) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      pBVar23 = local_178;
      cases = local_180;
      if ((TestContext *)local_168._M_p != (TestContext *)local_158) {
        operator_delete(local_168._M_p,(ulong)((long)(deUint32 *)local_158._0_8_ + 1));
      }
      pBVar23 = (pointer)&pBVar23->useImmutableSampler;
    } while (pBVar23 != (pointer)(cases->fence).paramsEnd);
  }
  pNVar36 = (cases->queryPool).paramsBegin;
  if (pNVar36 != (cases->queryPool).paramsEnd) {
    pBVar23 = (pointer)(local_1a8 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,pNVar36->name,(allocator<char> *)local_100);
      _Var17._M_p = local_168._M_p;
      local_1a8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_1a8[8] = 0;
      pTVar2 = (TestContext *)(cases->queryPool).function;
      local_178 = *(pointer *)&pNVar36->parameters;
      local_d0 = (TestContext *)CONCAT44(local_d0._4_4_,(pNVar36->parameters).pipelineStatistics);
      pTVar3 = this->m_testCtx;
      local_1b0 = (undefined1  [8])pBVar23;
      pTVar18 = (TestNode *)operator_new(0x90);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,_Var17._M_p,(char *)pBVar23);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d22ff8;
      pTVar18[1].m_testCtx = pTVar2;
      pTVar18[1].m_name._M_dataplus._M_p = (pointer)local_178;
      *(undefined4 *)&pTVar18[1].m_name._M_string_length = local_d0._0_4_;
      tcu::TestNode::addChild(this,pTVar18);
      if (local_1b0 != (undefined1  [8])pBVar23) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      cases = local_180;
      if ((TestContext *)local_168._M_p != (TestContext *)local_158) {
        operator_delete(local_168._M_p,(ulong)((long)(deUint32 *)local_158._0_8_ + 1));
      }
      pNVar36 = pNVar36 + 1;
    } while (pNVar36 != (cases->queryPool).paramsEnd);
  }
  pNVar37 = (cases->sampler).paramsBegin;
  if (pNVar37 != (cases->sampler).paramsEnd) {
    pBVar23 = (pointer)(local_f8 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,pNVar37->name,(allocator<char> *)local_80);
      auVar16 = local_1b0;
      local_f8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_f8[8] = 0;
      pTVar2 = (TestContext *)(cases->sampler).function;
      local_168._M_p = *(pointer *)&pNVar37->parameters;
      auStack_160 = *(undefined1 (*) [8])&(pNVar37->parameters).mipmapMode;
      local_158._0_8_ = *(undefined8 *)&(pNVar37->parameters).addressModeV;
      local_158._8_8_ = *(undefined8 *)&(pNVar37->parameters).mipLodBias;
      local_158._16_8_ = *(undefined8 *)&(pNVar37->parameters).maxAnisotropy;
      uVar7 = (pNVar37->parameters).compareOp;
      uVar8 = (pNVar37->parameters).minLod;
      uVar9 = (pNVar37->parameters).maxLod;
      uVar10 = (pNVar37->parameters).borderColor;
      uVar11 = (pNVar37->parameters).unnormalizedCoordinates;
      pTVar3 = this->m_testCtx;
      uStack_140 = uVar7;
      uStack_13c = uVar8;
      local_138 = uVar9;
      uStack_134 = uVar10;
      uStack_130 = uVar11;
      local_100 = (undefined1  [8])pBVar23;
      pTVar18 = (TestNode *)operator_new(0xc0);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,(char *)auVar16,(char *)pBVar23);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d23098;
      pTVar18[1].m_testCtx = pTVar2;
      pTVar18[1].m_name._M_dataplus._M_p = local_168._M_p;
      pTVar18[1].m_name._M_string_length = (size_type)auStack_160;
      pTVar18[1].m_name.field_2._M_allocated_capacity = local_158._0_8_;
      *(undefined8 *)((long)&pTVar18[1].m_name.field_2 + 8) = local_158._8_8_;
      pTVar18[1].m_description._M_dataplus._M_p = (pointer)local_158._16_8_;
      pTVar18[1].m_description._M_string_length = CONCAT44(uStack_13c,uStack_140);
      *(ulong *)((long)&pTVar18[1].m_description._M_string_length + 4) =
           CONCAT44(local_138,uStack_13c);
      *(ulong *)((long)&pTVar18[1].m_description.field_2 + 4) = CONCAT44(uStack_130,uStack_134);
      tcu::TestNode::addChild(this,pTVar18);
      if (local_100 != (undefined1  [8])pBVar23) {
        operator_delete((void *)local_100,CONCAT71(uStack_ef,local_f8[8]) + 1);
      }
      cases = local_180;
      if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      pNVar37 = pNVar37 + 1;
    } while (pNVar37 != (cases->sampler).paramsEnd);
  }
  pNVar24 = (cases->shaderModule).paramsBegin;
  if (pNVar24 != (cases->shaderModule).paramsEnd) {
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,pNVar24->name,&local_169);
      local_c0 = (pointer)(local_b8 + 8);
      local_b8._0_8_ = (pointer)0x0;
      local_b8[8] = 0;
      pTVar2 = (TestContext *)(local_180->shaderModule).function;
      local_80._0_4_ = (pNVar24->parameters).shaderStage;
      local_78 = (pointer)local_68;
      pcVar4 = (pNVar24->parameters).binaryName._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar4,
                 pcVar4 + (pNVar24->parameters).binaryName._M_string_length);
      pTVar3 = this->m_testCtx;
      local_100._0_4_ = local_80._0_4_;
      local_f8._0_8_ = local_e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f8,local_78,
                 (long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                           *)&local_78->binding)->
                        super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                        )._M_impl.super__Vector_impl_data._M_start +
                 (long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                           *)&local_70->binding)->
                        super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                        )._M_impl.super__Vector_impl_data._M_start);
      pTVar18 = (TestNode *)operator_new(0xa8);
      local_1b0._0_4_ = local_100._0_4_;
      local_1a8._0_8_ = local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,local_f8._0_8_,
                 (long)(VkDescriptorType *)local_f8._0_8_ + CONCAT71(uStack_ef,local_f8[8]));
      auStack_160._0_4_ = local_1b0._0_4_;
      local_168._M_p = (pointer)pTVar2;
      local_158._0_8_ = (pointer)(local_158 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_158,local_1a8._0_8_,
                 (long)(VkDescriptorType *)local_1a8._0_8_ + CONCAT71(uStack_19f,local_1a8[8]));
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,local_a0,(char *)local_c0);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory1_00d23138;
      pTVar18[1]._vptr_TestNode = (_func_int **)ShaderModule::initPrograms;
      pTVar18[1].m_testCtx = (TestContext *)local_168._M_p;
      *(undefined4 *)&pTVar18[1].m_name._M_dataplus._M_p = auStack_160._0_4_;
      pTVar18[1].m_name._M_string_length = (size_type)((long)&pTVar18[1].m_name.field_2 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pTVar18[1].m_name._M_string_length,local_158._0_8_,
                 (long)(deUint32 *)local_158._0_8_ +
                 (long)(vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                        *)local_158._8_8_);
      if ((pointer)local_158._0_8_ != (pointer)(local_158 + 0x10)) {
        operator_delete((void *)local_158._0_8_,(ulong)((long)(qpTestLog **)local_158._16_8_ + 1));
      }
      if ((VkDescriptorPoolSize *)local_1a8._0_8_ != local_198) {
        operator_delete((void *)local_1a8._0_8_,(long)local_198[0] + 1);
      }
      tcu::TestNode::addChild(this,pTVar18);
      if ((VkDescriptorPoolSize *)local_f8._0_8_ != local_e8) {
        operator_delete((void *)local_f8._0_8_,(long)local_e8[0] + 1);
      }
      if (local_78 != (pointer)local_68) {
        operator_delete(local_78,(ulong)((long)&local_68[0]->stageFlags + 1));
      }
      if (local_c0 != (pointer)(local_b8 + 8)) {
        operator_delete(local_c0,CONCAT71(uStack_af,local_b8[8]) + 1);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
      }
      pNVar24 = pNVar24 + 1;
    } while (pNVar24 != (local_180->shaderModule).paramsEnd);
  }
  pNVar38 = (local_180->pipelineCache).paramsBegin;
  pCVar29 = local_180;
  if (pNVar38 != (local_180->pipelineCache).paramsEnd) {
    pBVar23 = (pointer)(local_1a8 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,pNVar38->name,(allocator<char> *)local_100);
      _Var17._M_p = local_168._M_p;
      local_1a8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_1a8[8] = 0;
      pTVar2 = (TestContext *)(pCVar29->pipelineCache).function;
      pTVar3 = this->m_testCtx;
      local_1b0 = (undefined1  [8])pBVar23;
      pTVar18 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,_Var17._M_p,(char *)pBVar23);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d231d8;
      pTVar18[1].m_testCtx = pTVar2;
      tcu::TestNode::addChild(this,pTVar18);
      if (local_1b0 != (undefined1  [8])pBVar23) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      pCVar29 = local_180;
      if ((TestContext *)local_168._M_p != (TestContext *)local_158) {
        operator_delete(local_168._M_p,(ulong)((long)(deUint32 *)local_158._0_8_ + 1));
      }
      pNVar38 = pNVar38 + 1;
    } while (pNVar38 != (pCVar29->pipelineCache).paramsEnd);
  }
  pNVar44 = (pCVar29->pipelineLayout).paramsBegin;
  if (pNVar44 != (pCVar29->pipelineLayout).paramsEnd) {
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,pNVar44->name,&local_169);
      local_c0 = (pointer)(local_b8 + 8);
      local_b8._0_8_ = (pointer)0x0;
      local_b8[8] = 0;
      pTVar2 = (TestContext *)(local_180->pipelineLayout).function;
      PipelineLayout::Parameters::Parameters((Parameters *)local_80,&pNVar44->parameters);
      pTVar3 = this->m_testCtx;
      PipelineLayout::Parameters::Parameters((Parameters *)local_100,(Parameters *)local_80);
      pTVar18 = (TestNode *)operator_new(0xb0);
      PipelineLayout::Parameters::Parameters((Parameters *)local_1b0,(Parameters *)local_100);
      local_168._M_p = (pointer)pTVar2;
      PipelineLayout::Parameters::Parameters((Parameters *)auStack_160,(Parameters *)local_1b0);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,local_a0,(char *)local_c0);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory1_00d23278;
      pTVar18[1].m_testCtx = (TestContext *)local_168._M_p;
      PipelineLayout::Parameters::Parameters
                ((Parameters *)&pTVar18[1].m_name,(Parameters *)auStack_160);
      if ((pointer)local_158._16_8_ != (pointer)0x0) {
        operator_delete((void *)local_158._16_8_,CONCAT44(uStack_134,local_138) - local_158._16_8_);
      }
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
      ::~vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
                 *)auStack_160);
      if (local_198[0] != (VkDescriptorPoolSize)0x0) {
        operator_delete((void *)local_198[0],(long)local_188 - (long)local_198[0]);
      }
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
      ::~vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
                 *)local_1b0);
      tcu::TestNode::addChild(this,pTVar18);
      if (local_e8[0] != (VkDescriptorPoolSize)0x0) {
        operator_delete((void *)local_e8[0],(long)local_d8 - (long)local_e8[0]);
      }
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
      ::~vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
                 *)local_100);
      if (local_68[0] != (pointer)0x0) {
        operator_delete(local_68[0],(long)local_58 - (long)local_68[0]);
      }
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
      ::~vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
                 *)local_80);
      if (local_c0 != (pointer)(local_b8 + 8)) {
        operator_delete(local_c0,CONCAT71(uStack_af,local_b8[8]) + 1);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
      }
      pNVar44 = pNVar44 + 1;
    } while (pNVar44 != (local_180->pipelineLayout).paramsEnd);
  }
  pNVar39 = (local_180->renderPass).paramsBegin;
  pCVar29 = local_180;
  if (pNVar39 != (local_180->renderPass).paramsEnd) {
    pBVar23 = (pointer)(local_1a8 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,pNVar39->name,(allocator<char> *)local_100);
      _Var17._M_p = local_168._M_p;
      local_1a8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_1a8[8] = 0;
      pTVar2 = (TestContext *)(pCVar29->renderPass).function;
      pTVar3 = this->m_testCtx;
      local_1b0 = (undefined1  [8])pBVar23;
      pTVar18 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,_Var17._M_p,(char *)pBVar23);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d23318;
      pTVar18[1].m_testCtx = pTVar2;
      tcu::TestNode::addChild(this,pTVar18);
      if (local_1b0 != (undefined1  [8])pBVar23) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      pCVar29 = local_180;
      if ((TestContext *)local_168._M_p != (TestContext *)local_158) {
        operator_delete(local_168._M_p,(ulong)((long)(deUint32 *)local_158._0_8_ + 1));
      }
      pNVar39 = pNVar39 + 1;
    } while (pNVar39 != (pCVar29->renderPass).paramsEnd);
  }
  pNVar40 = (pCVar29->graphicsPipeline).paramsBegin;
  if (pNVar40 != (pCVar29->graphicsPipeline).paramsEnd) {
    pBVar23 = (pointer)(local_1a8 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,pNVar40->name,(allocator<char> *)local_100);
      _Var17._M_p = local_168._M_p;
      local_1a8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_1a8[8] = 0;
      pTVar2 = (TestContext *)(pCVar29->graphicsPipeline).function;
      pTVar3 = this->m_testCtx;
      local_1b0 = (undefined1  [8])pBVar23;
      pTVar18 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,_Var17._M_p,(char *)pBVar23);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d233b8;
      pTVar18[1]._vptr_TestNode = (_func_int **)GraphicsPipeline::initPrograms;
      pTVar18[1].m_testCtx = pTVar2;
      tcu::TestNode::addChild(this,pTVar18);
      if (local_1b0 != (undefined1  [8])pBVar23) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      pCVar29 = local_180;
      if ((TestContext *)local_168._M_p != (TestContext *)local_158) {
        operator_delete(local_168._M_p,(ulong)((long)(deUint32 *)local_158._0_8_ + 1));
      }
      pNVar40 = pNVar40 + 1;
    } while (pNVar40 != (pCVar29->graphicsPipeline).paramsEnd);
  }
  pNVar41 = (pCVar29->computePipeline).paramsBegin;
  if (pNVar41 != (pCVar29->computePipeline).paramsEnd) {
    pBVar23 = (pointer)(local_1a8 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,pNVar41->name,(allocator<char> *)local_100);
      _Var17._M_p = local_168._M_p;
      local_1a8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_1a8[8] = 0;
      pTVar2 = (TestContext *)(pCVar29->computePipeline).function;
      pTVar3 = this->m_testCtx;
      local_1b0 = (undefined1  [8])pBVar23;
      pTVar18 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,_Var17._M_p,(char *)pBVar23);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d23458;
      pTVar18[1]._vptr_TestNode = (_func_int **)ComputePipeline::initPrograms;
      pTVar18[1].m_testCtx = pTVar2;
      tcu::TestNode::addChild(this,pTVar18);
      if (local_1b0 != (undefined1  [8])pBVar23) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      pCVar29 = local_180;
      if ((TestContext *)local_168._M_p != (TestContext *)local_158) {
        operator_delete(local_168._M_p,(ulong)((long)(deUint32 *)local_158._0_8_ + 1));
      }
      pNVar41 = pNVar41 + 1;
    } while (pNVar41 != (pCVar29->computePipeline).paramsEnd);
  }
  pNVar30 = (pCVar29->descriptorSetLayout).paramsBegin;
  if (pNVar30 != (pCVar29->descriptorSetLayout).paramsEnd) {
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,pNVar30->name,(allocator<char> *)&local_a0);
      local_f8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_f8[8] = 0;
      local_d0 = (TestContext *)(pCVar29->descriptorSetLayout).function;
      pPVar27 = &pNVar30->parameters;
      local_100 = (undefined1  [8])(local_f8 + 8);
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)local_80,&pPVar27->bindings);
      pBVar12 = local_78;
      local_38 = this->m_testCtx;
      pBVar23 = (pointer)CONCAT44(local_80._4_4_,local_80._0_4_);
      local_50 = (long)local_78 - (long)pBVar23;
      local_178 = std::
                  _Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                  ::_M_allocate((_Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                 *)(((long)local_50 >> 2) * -0x3333333333333333),(size_t)pPVar27);
      pBVar45 = local_178;
      for (pBVar20 = pBVar23; pBVar20 != pBVar12; pBVar20 = pBVar20 + 1) {
        *(undefined4 *)&pBVar45->useImmutableSampler = *(undefined4 *)&pBVar20->useImmutableSampler;
        VVar13 = pBVar20->descriptorType;
        pBVar19 = *(pointer *)&pBVar20->descriptorCount;
        pBVar45->binding = pBVar20->binding;
        pBVar45->descriptorType = VVar13;
        *(pointer *)&pBVar45->descriptorCount = pBVar19;
        pBVar45 = pBVar45 + 1;
      }
      local_c8 = pBVar23;
      local_40 = pNVar30;
      local_48 = (TestNode *)operator_new(0x98);
      pBVar12 = local_178;
      uVar22 = (long)pBVar45 - (long)local_178;
      pBVar19 = std::
                _Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                ::_M_allocate((_Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                               *)(((long)uVar22 >> 2) * -0x3333333333333333),(size_t)pPVar27);
      pBVar23 = pBVar19;
      pBVar20 = local_178;
      while (pBVar12 != pBVar45) {
        uVar14 = *(undefined3 *)&pBVar20->field_0x11;
        pBVar23->useImmutableSampler = pBVar20->useImmutableSampler;
        *(undefined3 *)&pBVar23->field_0x11 = uVar14;
        VVar13 = pBVar20->descriptorType;
        dVar1 = pBVar20->descriptorCount;
        VVar15 = pBVar20->stageFlags;
        pBVar23->binding = pBVar20->binding;
        pBVar23->descriptorType = VVar13;
        pBVar23->descriptorCount = dVar1;
        pBVar23->stageFlags = VVar15;
        pBVar23 = pBVar23 + 1;
        pBVar20 = pBVar20 + 1;
        pBVar12 = pBVar20;
      }
      local_168._M_p = (pointer)local_d0;
      uVar46 = (long)pBVar23 - (long)pBVar19;
      pBVar20 = std::
                _Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                ::_M_allocate((_Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                               *)(((long)uVar46 >> 2) * -0x3333333333333333),(size_t)pPVar27);
      pTVar18 = local_48;
      local_158._8_8_ = (long)pBVar20 + uVar46;
      local_158._0_8_ = pBVar20;
      for (pBVar45 = pBVar19; pBVar45 != pBVar23; pBVar45 = pBVar45 + 1) {
        uVar14 = *(undefined3 *)&pBVar45->field_0x11;
        ((pointer)local_158._0_8_)->useImmutableSampler = pBVar45->useImmutableSampler;
        *(undefined3 *)&((pointer)local_158._0_8_)->field_0x11 = uVar14;
        VVar13 = pBVar45->descriptorType;
        dVar1 = pBVar45->descriptorCount;
        VVar15 = pBVar45->stageFlags;
        ((pointer)local_158._0_8_)->binding = pBVar45->binding;
        ((pointer)local_158._0_8_)->descriptorType = VVar13;
        ((pointer)local_158._0_8_)->descriptorCount = dVar1;
        ((pointer)local_158._0_8_)->stageFlags = VVar15;
        local_158._0_8_ = local_158._0_8_ + 0x14;
      }
      auStack_160 = (undefined1  [8])pBVar20;
      tcu::TestCase::TestCase
                ((TestCase *)local_48,local_38,NODETYPE_SELF_VALIDATE,(char *)local_1b0,
                 (char *)local_100);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory1_00d234f8;
      pTVar18[1].m_testCtx = local_d0;
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)&pTVar18[1].m_name,
               (vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)auStack_160);
      if (pBVar20 != (pointer)0x0) {
        operator_delete(pBVar20,uVar46);
      }
      if (pBVar19 != (pointer)0x0) {
        operator_delete(pBVar19,uVar22);
      }
      tcu::TestNode::addChild(this,pTVar18);
      pNVar30 = local_40;
      pBVar23 = local_c8;
      pCVar29 = local_180;
      if (local_178 != (pointer)0x0) {
        operator_delete(local_178,local_50);
      }
      if (pBVar23 != (pointer)0x0) {
        operator_delete(pBVar23,(long)local_70 - (long)pBVar23);
      }
      if (local_100 != (undefined1  [8])(local_f8 + 8)) {
        operator_delete((void *)local_100,CONCAT71(uStack_ef,local_f8[8]) + 1);
      }
      if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      pNVar30 = pNVar30 + 1;
    } while (pNVar30 != (pCVar29->descriptorSetLayout).paramsEnd);
  }
  pNVar47 = (pCVar29->descriptorPool).paramsBegin;
  if (pNVar47 != (pCVar29->descriptorPool).paramsEnd) {
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_80,pNVar47->name,&local_169);
      local_a0 = &local_90;
      local_98 = 0;
      local_90 = '\0';
      pTVar2 = (TestContext *)(local_180->descriptorPool).function;
      local_c0 = *(pointer *)&pNVar47->parameters;
      std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::vector
                ((vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *)
                 local_b8,&(pNVar47->parameters).poolSizes);
      pTVar3 = this->m_testCtx;
      local_100 = (undefined1  [8])local_c0;
      std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::vector
                ((vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *)
                 local_f8,(vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                           *)local_b8);
      pTVar18 = (TestNode *)operator_new(0xa0);
      local_1b0 = local_100;
      std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::vector
                ((vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *)
                 local_1a8,
                 (vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *)
                 local_f8);
      auStack_160 = local_1b0;
      local_168._M_p = (pointer)pTVar2;
      std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::vector
                ((vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *)
                 local_158,
                 (vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *)
                 local_1a8);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,
                 (char *)CONCAT44(local_80._4_4_,local_80._0_4_),local_a0);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory1_00d23598;
      pTVar18[1].m_testCtx = (TestContext *)local_168._M_p;
      pTVar18[1].m_name._M_dataplus._M_p = (pointer)auStack_160;
      std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::vector
                ((vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *)
                 &pTVar18[1].m_name._M_string_length,
                 (vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *)
                 local_158);
      if ((pointer)local_158._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ - local_158._0_8_);
      }
      if ((VkDescriptorPoolSize *)local_1a8._0_8_ != (VkDescriptorPoolSize *)0x0) {
        operator_delete((void *)local_1a8._0_8_,(long)local_198[0] - local_1a8._0_8_);
      }
      tcu::TestNode::addChild(this,pTVar18);
      if ((VkDescriptorPoolSize *)local_f8._0_8_ != (VkDescriptorPoolSize *)0x0) {
        operator_delete((void *)local_f8._0_8_,(long)local_e8[0] - local_f8._0_8_);
      }
      if ((pointer)local_b8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_b8._0_8_,(long)local_a8 - local_b8._0_8_);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
      }
      if ((pointer *)CONCAT44(local_80._4_4_,local_80._0_4_) != &local_70) {
        operator_delete((pointer *)CONCAT44(local_80._4_4_,local_80._0_4_),
                        (ulong)((long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                          *)&local_70->binding)->
                                       super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      pNVar47 = pNVar47 + 1;
    } while (pNVar47 != (local_180->descriptorPool).paramsEnd);
  }
  pNVar30 = (NamedParameters<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *)
            (local_180->descriptorSet).paramsBegin;
  pCVar29 = local_180;
  if (pNVar30 !=
      (NamedParameters<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *)
      (local_180->descriptorSet).paramsEnd) {
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,pNVar30->name,(allocator<char> *)&local_a0);
      local_f8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_f8[8] = 0;
      local_d0 = (TestContext *)(pCVar29->descriptorSet).function;
      pPVar27 = &pNVar30->parameters;
      local_100 = (undefined1  [8])(local_f8 + 8);
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)local_80,&pPVar27->bindings);
      pBVar12 = local_78;
      local_38 = this->m_testCtx;
      pBVar23 = (pointer)CONCAT44(local_80._4_4_,local_80._0_4_);
      local_50 = (long)local_78 - (long)pBVar23;
      local_178 = std::
                  _Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                  ::_M_allocate((_Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                 *)(((long)local_50 >> 2) * -0x3333333333333333),(size_t)pPVar27);
      pBVar45 = local_178;
      for (pBVar20 = pBVar23; pBVar20 != pBVar12; pBVar20 = pBVar20 + 1) {
        *(undefined4 *)&pBVar45->useImmutableSampler = *(undefined4 *)&pBVar20->useImmutableSampler;
        VVar13 = pBVar20->descriptorType;
        pBVar19 = *(pointer *)&pBVar20->descriptorCount;
        pBVar45->binding = pBVar20->binding;
        pBVar45->descriptorType = VVar13;
        *(pointer *)&pBVar45->descriptorCount = pBVar19;
        pBVar45 = pBVar45 + 1;
      }
      local_c8 = pBVar23;
      local_40 = pNVar30;
      local_48 = (TestNode *)operator_new(0x98);
      pBVar12 = local_178;
      uVar22 = (long)pBVar45 - (long)local_178;
      pBVar19 = std::
                _Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                ::_M_allocate((_Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                               *)(((long)uVar22 >> 2) * -0x3333333333333333),(size_t)pPVar27);
      pBVar23 = pBVar19;
      pBVar20 = local_178;
      while (pBVar12 != pBVar45) {
        uVar14 = *(undefined3 *)&pBVar20->field_0x11;
        pBVar23->useImmutableSampler = pBVar20->useImmutableSampler;
        *(undefined3 *)&pBVar23->field_0x11 = uVar14;
        VVar13 = pBVar20->descriptorType;
        dVar1 = pBVar20->descriptorCount;
        VVar15 = pBVar20->stageFlags;
        pBVar23->binding = pBVar20->binding;
        pBVar23->descriptorType = VVar13;
        pBVar23->descriptorCount = dVar1;
        pBVar23->stageFlags = VVar15;
        pBVar23 = pBVar23 + 1;
        pBVar20 = pBVar20 + 1;
        pBVar12 = pBVar20;
      }
      local_168._M_p = (pointer)local_d0;
      uVar46 = (long)pBVar23 - (long)pBVar19;
      pBVar20 = std::
                _Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                ::_M_allocate((_Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                               *)(((long)uVar46 >> 2) * -0x3333333333333333),(size_t)pPVar27);
      pTVar18 = local_48;
      local_158._8_8_ = (long)pBVar20 + uVar46;
      local_158._0_8_ = pBVar20;
      for (pBVar45 = pBVar19; pBVar45 != pBVar23; pBVar45 = pBVar45 + 1) {
        uVar14 = *(undefined3 *)&pBVar45->field_0x11;
        ((pointer)local_158._0_8_)->useImmutableSampler = pBVar45->useImmutableSampler;
        *(undefined3 *)&((pointer)local_158._0_8_)->field_0x11 = uVar14;
        VVar13 = pBVar45->descriptorType;
        dVar1 = pBVar45->descriptorCount;
        VVar15 = pBVar45->stageFlags;
        ((pointer)local_158._0_8_)->binding = pBVar45->binding;
        ((pointer)local_158._0_8_)->descriptorType = VVar13;
        ((pointer)local_158._0_8_)->descriptorCount = dVar1;
        ((pointer)local_158._0_8_)->stageFlags = VVar15;
        local_158._0_8_ = local_158._0_8_ + 0x14;
      }
      auStack_160 = (undefined1  [8])pBVar20;
      tcu::TestCase::TestCase
                ((TestCase *)local_48,local_38,NODETYPE_SELF_VALIDATE,(char *)local_1b0,
                 (char *)local_100);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory1_00d23638;
      pTVar18[1].m_testCtx = local_d0;
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)&pTVar18[1].m_name,
               (vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)auStack_160);
      if (pBVar20 != (pointer)0x0) {
        operator_delete(pBVar20,uVar46);
      }
      if (pBVar19 != (pointer)0x0) {
        operator_delete(pBVar19,uVar22);
      }
      tcu::TestNode::addChild(this,pTVar18);
      pNVar30 = local_40;
      pBVar23 = local_c8;
      pCVar29 = local_180;
      if (local_178 != (pointer)0x0) {
        operator_delete(local_178,local_50);
      }
      if (pBVar23 != (pointer)0x0) {
        operator_delete(pBVar23,(long)local_70 - (long)pBVar23);
      }
      if (local_100 != (undefined1  [8])(local_f8 + 8)) {
        operator_delete((void *)local_100,CONCAT71(uStack_ef,local_f8[8]) + 1);
      }
      if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      pNVar30 = pNVar30 + 1;
    } while (pNVar30 !=
             (NamedParameters<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *)
             (pCVar29->descriptorSet).paramsEnd);
  }
  pNVar42 = (pCVar29->framebuffer).paramsBegin;
  if (pNVar42 != (pCVar29->framebuffer).paramsEnd) {
    pBVar23 = (pointer)(local_1a8 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,pNVar42->name,(allocator<char> *)local_100);
      _Var17._M_p = local_168._M_p;
      local_1a8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_1a8[8] = 0;
      pTVar2 = (TestContext *)(pCVar29->framebuffer).function;
      pTVar3 = this->m_testCtx;
      local_1b0 = (undefined1  [8])pBVar23;
      pTVar18 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,_Var17._M_p,(char *)pBVar23);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d236d8;
      pTVar18[1].m_testCtx = pTVar2;
      tcu::TestNode::addChild(this,pTVar18);
      if (local_1b0 != (undefined1  [8])pBVar23) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      pCVar29 = local_180;
      if ((TestContext *)local_168._M_p != (TestContext *)local_158) {
        operator_delete(local_168._M_p,(ulong)((long)(deUint32 *)local_158._0_8_ + 1));
      }
      pNVar42 = pNVar42 + 1;
    } while (pNVar42 != (pCVar29->framebuffer).paramsEnd);
  }
  pBVar23 = (pointer)(pCVar29->commandPool).paramsBegin;
  if (pBVar23 != (pointer)(pCVar29->commandPool).paramsEnd) {
    pBVar45 = (pointer)(local_1a8 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,*(char **)pBVar23,(allocator<char> *)local_100);
      _Var17._M_p = local_168._M_p;
      local_1a8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_1a8[8] = 0;
      pTVar2 = (TestContext *)(pCVar29->commandPool).function;
      dVar1 = pBVar23->descriptorCount;
      pTVar3 = this->m_testCtx;
      local_1b0 = (undefined1  [8])pBVar45;
      local_178 = pBVar23;
      pTVar18 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,_Var17._M_p,(char *)pBVar45);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d23778;
      pTVar18[1].m_testCtx = pTVar2;
      *(deUint32 *)&pTVar18[1].m_name._M_dataplus._M_p = dVar1;
      tcu::TestNode::addChild(this,pTVar18);
      if (local_1b0 != (undefined1  [8])pBVar45) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      pBVar23 = local_178;
      pCVar29 = local_180;
      if ((TestContext *)local_168._M_p != (TestContext *)local_158) {
        operator_delete(local_168._M_p,(ulong)((long)(deUint32 *)local_158._0_8_ + 1));
      }
      pBVar23 = (pointer)&pBVar23->useImmutableSampler;
    } while (pBVar23 != (pointer)(pCVar29->commandPool).paramsEnd);
  }
  pBVar23 = (pointer)(pCVar29->commandBuffer).paramsBegin;
  if (pBVar23 != (pointer)(pCVar29->commandBuffer).paramsEnd) {
    pBVar45 = (pointer)(local_1a8 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,*(char **)pBVar23,(allocator<char> *)local_100);
      _Var17._M_p = local_168._M_p;
      local_1a8._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_1a8[8] = 0;
      pTVar2 = (TestContext *)(pCVar29->commandBuffer).function;
      pcVar4 = *(pointer *)&pBVar23->descriptorCount;
      pTVar3 = this->m_testCtx;
      local_1b0 = (undefined1  [8])pBVar45;
      local_178 = pBVar23;
      pTVar18 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar18,pTVar3,NODETYPE_SELF_VALIDATE,_Var17._M_p,(char *)pBVar45);
      pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d23818;
      pTVar18[1].m_testCtx = pTVar2;
      pTVar18[1].m_name._M_dataplus._M_p = pcVar4;
      tcu::TestNode::addChild(this,pTVar18);
      if (local_1b0 != (undefined1  [8])pBVar45) {
        operator_delete((void *)local_1b0,CONCAT71(uStack_19f,local_1a8[8]) + 1);
      }
      pBVar23 = local_178;
      pCVar29 = local_180;
      if ((TestContext *)local_168._M_p != (TestContext *)local_158) {
        operator_delete(local_168._M_p,(ulong)((long)(deUint32 *)local_158._0_8_ + 1));
      }
      pBVar23 = (pointer)&pBVar23->useImmutableSampler;
    } while (pBVar23 != (pointer)(pCVar29->commandBuffer).paramsEnd);
  }
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createGroup (tcu::TestContext& testCtx, const char* name, const char* desc, const CaseDescriptions& cases)
{
	MovePtr<tcu::TestCaseGroup>	group	(new tcu::TestCaseGroup(testCtx, name, desc));

	addCases			(group, cases.instance);
	addCases			(group, cases.device);
	addCases			(group, cases.deviceMemory);
	addCases			(group, cases.buffer);
	addCases			(group, cases.bufferView);
	addCases			(group, cases.image);
	addCases			(group, cases.imageView);
	addCases			(group, cases.semaphore);
	addCases			(group, cases.event);
	addCases			(group, cases.fence);
	addCases			(group, cases.queryPool);
	addCases			(group, cases.sampler);
	addCasesWithProgs	(group, cases.shaderModule);
	addCases			(group, cases.pipelineCache);
	addCases			(group, cases.pipelineLayout);
	addCases			(group, cases.renderPass);
	addCasesWithProgs	(group, cases.graphicsPipeline);
	addCasesWithProgs	(group, cases.computePipeline);
	addCases			(group, cases.descriptorSetLayout);
	addCases			(group, cases.descriptorPool);
	addCases			(group, cases.descriptorSet);
	addCases			(group, cases.framebuffer);
	addCases			(group, cases.commandPool);
	addCases			(group, cases.commandBuffer);

	return group.release();
}